

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.cpp
# Opt level: O0

void embree::skipSpacesAndComments(fstream *file)

{
  int iVar1;
  istream *in_RDI;
  string line;
  string local_28 [32];
  istream *local_8;
  
  local_8 = in_RDI;
  while( true ) {
    while( true ) {
      iVar1 = std::istream::peek();
      iVar1 = isspace(iVar1);
      if (iVar1 == 0) break;
      std::istream::ignore();
    }
    iVar1 = std::istream::peek();
    if (iVar1 != 0x23) break;
    std::__cxx11::string::string(local_28);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8,local_28);
    std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

static void skipSpacesAndComments(std::fstream& file)
  {
    while (true)
    {
      if  (isspace(file.peek())) {
        file.ignore();
      } else  if (file.peek() == '#') {
        std::string line; std::getline(file,line);
      } else break;
    }
  }